

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  lua_Debug ar;
  luaL_Buffer b;
  
  uVar1 = 1;
  uVar7 = 1;
  do {
    uVar6 = uVar7;
    uVar7 = uVar1;
    iVar2 = lua_getstack(L1,(int)uVar7,(lua_Debug *)&b);
    uVar1 = (ulong)(uint)((int)uVar7 * 2);
  } while (iVar2 != 0);
  while( true ) {
    uVar8 = (uint)uVar6;
    iVar2 = (int)uVar7;
    if (iVar2 <= (int)uVar8) break;
    uVar1 = (long)(int)(uVar8 + iVar2) / 2;
    iVar2 = (int)uVar1;
    iVar3 = lua_getstack(L1,iVar2,(lua_Debug *)&b);
    uVar5 = iVar2 + 1;
    if (iVar3 == 0) {
      uVar5 = uVar8;
      uVar7 = uVar1 & 0xffffffff;
    }
    uVar6 = (ulong)uVar5;
  }
  luaL_buffinit(L,&b);
  if (msg != (char *)0x0) {
    luaL_addstring(&b,msg);
    if (b.size <= b.n) {
      luaL_prepbuffsize(&b,1);
    }
    b.b[b.n] = '\n';
    b.n = b.n + 1;
  }
  uVar8 = -(uint)(-0x17 < level - iVar2) | 10;
  luaL_addstring(&b,"stack traceback:");
  do {
    while( true ) {
      iVar3 = lua_getstack(L1,level,&ar);
      if (iVar3 == 0) {
        luaL_pushresult(&b);
        return;
      }
      bVar9 = uVar8 != 0;
      uVar8 = uVar8 - 1;
      if (bVar9) break;
      lua_pushfstring(L,"\n\t...\t(skipping %d levels)",(ulong)(~level + (iVar2 - 0xbU)));
      luaL_addvalue(&b);
      level = iVar2 - 0xbU;
    }
    lua_getinfo(L1,"Slnt",&ar);
    if (ar.currentline < 1) {
      lua_pushfstring(L,"\n\t%s: in ",ar.short_src);
    }
    else {
      lua_pushfstring(L,"\n\t%s:%d: in ",ar.short_src);
    }
    luaL_addvalue(&b);
    iVar3 = pushglobalfuncname(L,&ar);
    if (iVar3 == 0) {
      if (*ar.namewhat == '\0') {
        if (*ar.what == 'C') {
          pcVar4 = "?";
        }
        else {
          if (*ar.what != 'm') {
            lua_pushfstring(L,"function <%s:%d>",ar.short_src,(ulong)(uint)ar.linedefined);
            goto LAB_00109cdc;
          }
          pcVar4 = "main chunk";
        }
        lua_pushstring(L,pcVar4);
      }
      else {
        lua_pushfstring(L,"%s \'%s\'",ar.namewhat,ar.name);
      }
    }
    else {
      pcVar4 = lua_tolstring(L,-1,(size_t *)0x0);
      lua_pushfstring(L,"function \'%s\'",pcVar4);
      lua_rotate(L,-2,-1);
      lua_settop(L,-2);
    }
LAB_00109cdc:
    level = level + 1;
    luaL_addvalue(&b);
    if (ar.istailcall != '\0') {
      luaL_addstring(&b,"\n\t(...tail calls...)");
    }
  } while( true );
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  luaL_Buffer b;
  lua_Debug ar;
  int last = lastlevel(L1);
  int limit2show = (last - level > LEVELS1 + LEVELS2) ? LEVELS1 : -1;
  luaL_buffinit(L, &b);
  if (msg) {
    luaL_addstring(&b, msg);
    luaL_addchar(&b, '\n');
  }
  luaL_addstring(&b, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (limit2show-- == 0) {  /* too many levels? */
      int n = last - level - LEVELS2 + 1;  /* number of levels to skip */
      lua_pushfstring(L, "\n\t...\t(skipping %d levels)", n);
      luaL_addvalue(&b);  /* add warning about skip */
      level += n;  /* and skip to last levels */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      if (ar.currentline <= 0)
        lua_pushfstring(L, "\n\t%s: in ", ar.short_src);
      else
        lua_pushfstring(L, "\n\t%s:%d: in ", ar.short_src, ar.currentline);
      luaL_addvalue(&b);
      pushfuncname(L, &ar);
      luaL_addvalue(&b);
      if (ar.istailcall)
        luaL_addstring(&b, "\n\t(...tail calls...)");
    }
  }
  luaL_pushresult(&b);
}